

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_portable.c
# Opt level: O3

void blake3_compress_in_place_portable
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags)

{
  undefined1 auVar1 [16];
  undefined3 in_register_00000011;
  undefined3 in_register_00000081;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  
  auVar4 = vpinsrb_avx(ZEXT116(block[0x27]),(uint)block[0x1b],1);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[0x3f],2);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[3],3);
  auVar9 = vpshufb_avx(auVar4,_DAT_0010c0c0);
  auVar4 = vpinsrw_avx(ZEXT216(*(ushort *)(block + 0x10)),(uint)*(ushort *)(block + 0x34),2);
  auVar4 = vpinsrw_avx(auVar4,(uint)*(ushort *)(block + 0x28),4);
  auVar12 = vpinsrw_avx(auVar4,(uint)*(ushort *)(block + 0x30),6);
  auVar4 = vpinsrb_avx(ZEXT116(block[0x12]),(uint)block[0x36],1);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[0x2a],2);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[0x32],3);
  auVar14 = vpinsrb_avx(ZEXT116(block[0x13]),(uint)block[0x37],1);
  auVar14 = vpinsrb_avx(auVar14,(uint)block[0x2b],2);
  auVar14 = vpinsrb_avx(auVar14,(uint)block[0x33],3);
  auVar4 = vpshufb_avx(auVar4,_DAT_0010c0d0);
  auVar14 = vpshufb_avx(auVar14,_DAT_0010c0c0);
  auVar2 = vpternlogd_avx512vl(auVar14,auVar4,auVar12,0xfe);
  auVar4 = vpinsrw_avx(ZEXT216(*(ushort *)(block + 0xc)),(uint)*(ushort *)(block + 0x1c),2);
  auVar4 = vpinsrw_avx(auVar4,(uint)*(ushort *)(block + 0x38),4);
  auVar12 = vpinsrw_avx(auVar4,(uint)*(ushort *)(block + 8),6);
  auVar4 = vpinsrb_avx(ZEXT116(block[0xe]),(uint)block[0x1e],1);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[0x3a],2);
  auVar4 = vpinsrb_avx(auVar4,(uint)block[10],3);
  auVar14 = vpinsrb_avx(ZEXT116(block[0xf]),(uint)block[0x1f],1);
  auVar14 = vpinsrb_avx(auVar14,(uint)block[0x3b],2);
  auVar10 = vpshufb_avx(auVar4,_DAT_0010c0d0);
  auVar4 = vpinsrb_avx(auVar14,(uint)block[0xb],3);
  auVar4 = vpshufb_avx(auVar4,_DAT_0010c0c0);
  auVar3 = vpternlogd_avx512vl(auVar4,auVar10,auVar12,0xfe);
  auVar4 = vpinsrd_avx(ZEXT316(*(uint3 *)(block + 0x24)),(uint)*(uint3 *)(block + 0x18),1);
  auVar4 = vpinsrd_avx(auVar4,(uint)*(uint3 *)(block + 0x3c),2);
  auVar4 = vpinsrd_avx(auVar4,(uint)*(uint3 *)block,3);
  auVar1 = vpor_avx(auVar4,auVar9);
  auVar13 = vpshufd_avx(auVar3,0xee);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x1000503));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar1,auVar13);
  uVar15 = auVar2._0_4_;
  auVar16._4_4_ = uVar15;
  auVar16._0_4_ = uVar15;
  auVar16._8_4_ = uVar15;
  auVar16._12_4_ = uVar15;
  auVar4 = vpblendd_avx2(auVar4,auVar16,4);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])cv);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])(cv + 4));
  auVar14 = vpinsrb_avx(ZEXT416(CONCAT31(in_register_00000011,block_len)),
                        CONCAT31(in_register_00000081,flags),4);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = counter;
  auVar14 = vpunpcklqdq_avx(auVar12,auVar14);
  auVar5 = vprold_avx512vl(auVar4 ^ auVar14,0x10);
  auVar14 = vpaddd_avx(auVar5,_DAT_0010c0f0);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x70301));
  auVar9 = vpblendd_avx2(auVar2,auVar1,0xc);
  auVar6 = vpermi2d_avx512vl(auVar12,auVar9,auVar3);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x1000600));
  auVar10 = vpmovsxbd_avx(ZEXT416(0x3050100));
  auVar7 = vpermi2d_avx512vl(auVar12,auVar3,auVar2);
  auVar12 = vpinsrw_avx(ZEXT216(*(ushort *)(block + 4)),(uint)*(ushort *)(block + 0x20),2);
  auVar12 = vpinsrw_avx(auVar12,(uint)*(ushort *)(block + 0x2c),4);
  auVar9 = vpinsrw_avx(auVar12,(uint)*(ushort *)(block + 0x14),6);
  auVar12 = vpinsrb_avx(ZEXT116(block[6]),(uint)block[0x22],1);
  auVar8 = vpermi2d_avx512vl(auVar10,auVar7,auVar1);
  auVar12 = vpinsrb_avx(auVar12,(uint)block[0x2e],2);
  auVar12 = vpinsrb_avx(auVar12,(uint)block[0x16],3);
  auVar10 = vpshufb_avx(auVar12,_DAT_0010c0d0);
  auVar12 = vpinsrb_avx(ZEXT116(block[7]),(uint)block[0x23],1);
  auVar12 = vpinsrb_avx(auVar12,(uint)block[0x2f],2);
  auVar7 = vshufps_avx(auVar3,auVar2,0xf6);
  auVar12 = vpinsrb_avx(auVar12,(uint)block[0x17],3);
  auVar12 = vpshufb_avx(auVar12,_DAT_0010c0c0);
  auVar9 = vpternlogd_avx512vl(auVar12,auVar10,auVar9,0xfe);
  auVar12 = vpshufd_avx(auVar14 ^ *(undefined1 (*) [16])(cv + 4),0x93);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar12 = vpshufd_avx(auVar4,0x93);
  auVar11 = vprolq_avx512vl(auVar3,0x20);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x7010400));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar11,auVar9);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar4,0x39);
  auVar5 = vprold_avx512vl(auVar12 ^ auVar5,0x18);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar12 = vpunpckhqdq_avx(auVar3,auVar2);
  auVar12 = vpblendd_avx2(auVar12,auVar9,2);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar12 = vpaddd_avx(auVar4,auVar10);
  auVar4 = vpshufd_avx(auVar5,0x4e);
  auVar5 = vprold_avx512vl(auVar12 ^ auVar4,0x10);
  auVar4 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar5,auVar4);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar4 = vshufps_avx(auVar1,auVar9,0xe2);
  auVar4 = vinsertps_avx(auVar4,auVar2,0x70);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar4 ^ auVar5,0x93);
  auVar5 = vprold_avx512vl(auVar12,0x18);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x1000304));
  auVar12 = vpermi2d_avx512vl(auVar12,auVar3,auVar2);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar5,0x4e);
  auVar5 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar12 = vpshufd_avx(auVar4,0x93);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x6010503));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar1,auVar2);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar4,0x39);
  auVar5 = vprold_avx512vl(auVar12 ^ auVar5,0x18);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar17._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar1;
  auVar17._16_16_ = ZEXT116(1) * auVar9;
  auVar12 = vpmovqd_avx512vl(auVar17);
  auVar12 = vpblendd_avx2(auVar12,auVar2,8);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar5,0x4e);
  auVar5 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar5,auVar14);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar12 = vpblendd_avx2(auVar9,auVar13,1);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar5,0x18);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar12,0x19);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x2040501));
  auVar12 = vpermi2d_avx512vl(auVar12,auVar2,auVar3);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar13,0x39);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x4e);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x4e);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar4 = vpshufd_avx(auVar4,0x4e);
  auVar12 = vshufps_avx(auVar2,auVar3,0xbc);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x18);
  auVar12 = vpshufd_avx(auVar13,0x39);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar12,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar12 = vshufps_avx(auVar1,auVar9,0x61);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar13,0x93);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x60703));
  auVar12 = vpermi2d_avx512vl(auVar12,auVar9,auVar1);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar4 ^ auVar13,0x93);
  auVar13 = vprold_avx512vl(auVar12,0x18);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x1060302));
  auVar12 = vpermi2d_avx512vl(auVar12,auVar2,auVar3);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar12 = vpshufd_avx(auVar4,0x93);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x5000402));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar1,auVar11);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar4,auVar10);
  auVar12 = vpshufd_avx(auVar4,0x39);
  auVar13 = vprold_avx512vl(auVar12 ^ auVar13,0x18);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar12 = vpblendd_avx2(auVar9,auVar16,2);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar12 = vpaddd_avx(auVar10,auVar4);
  auVar4 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar4 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar13,auVar4);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar4 = vshufps_avx(auVar1,auVar3,0xfd);
  auVar4 = vinsertps_avx(auVar4,auVar9,0x70);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar12 = vpaddd_avx(auVar10,auVar4);
  auVar4 = vpshufd_avx(auVar13 ^ auVar12,0x93);
  auVar13 = vprold_avx512vl(auVar4,0x18);
  auVar4 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar13,auVar4);
  auVar4 = vpshufd_avx(auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar4,0x19);
  auVar4 = vshufps_avx(auVar3,auVar1,0x86);
  auVar4 = vinsertps_avx(auVar4,auVar2,0xd0);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar12 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar12 ^ auVar4,0x10);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar12 = vpshufd_avx(auVar4,0x93);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x6010502));
  auVar4 = vpermi2d_avx512vl(auVar4,auVar2,auVar9);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar12 = vpaddd_avx(auVar10,auVar4);
  auVar4 = vpshufd_avx(auVar12,0x39);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar13,0x18);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar4 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar4,0x19);
  auVar4 = vshufps_avx(auVar1,auVar3,0xd7);
  auVar4 = vblendps_avx(auVar4,auVar9,8);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar12 = vpaddd_avx(auVar10,auVar4);
  auVar4 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar4 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar13,auVar4);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar10,0x14);
  auVar4 = vshufps_avx(auVar9,auVar3,0x34);
  auVar4 = vinsertps_avx(auVar4,auVar2,0x10);
  auVar4 = vpaddd_avx(auVar4,auVar12);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar13 = vprold_avx512vl(auVar13 ^ auVar4,0x18);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x93);
  auVar10 = vprold_avx512vl(auVar12,0x19);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x2040601));
  auVar12 = vpermi2d_avx512vl(auVar12,auVar9,auVar1);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar12 = vpshufd_avx(auVar13,0x39);
  auVar13 = vprold_avx512vl(auVar12 ^ auVar4,0x10);
  auVar14 = vpshufd_avx(auVar14,0x4e);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar12 = vpshufd_avx(auVar14 ^ auVar10,0x4e);
  auVar10 = vprold_avx512vl(auVar12,0x14);
  auVar4 = vpshufd_avx(auVar4,0x4e);
  auVar12 = vpermi2ps_avx512vl(_DAT_0010c1c0,auVar7,auVar9);
  auVar4 = vpaddd_avx(auVar12,auVar4);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar12 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x18);
  auVar12 = vpshufd_avx(auVar13,0x39);
  auVar14 = vpshufd_avx(auVar14,0x93);
  auVar14 = vpaddd_avx(auVar12,auVar14);
  auVar12 = vpshufd_avx(auVar10,0x39);
  auVar10 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar4 = vpaddd_avx(auVar4,auVar6);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar12 = vpshufd_avx(auVar13,0x93);
  auVar12 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar12,auVar14);
  auVar10 = vprold_avx512vl(auVar10 ^ auVar14,0x14);
  auVar4 = vpaddd_avx(auVar4,auVar8);
  auVar4 = vpaddd_avx(auVar10,auVar4);
  auVar13 = vprold_avx512vl(auVar4 ^ auVar12,0x18);
  auVar14 = vpaddd_avx(auVar13,auVar14);
  auVar4 = vpshufd_avx(auVar4,0x4e);
  auVar4 = vpaddd_avx(auVar4,auVar9);
  auVar12 = vpshufd_avx(auVar10 ^ auVar14,0x39);
  auVar9 = vprold_avx512vl(auVar12,0x19);
  auVar4 = vpaddd_avx(auVar4,auVar9);
  auVar12 = vpshufd_avx(auVar4,0x39);
  auVar10 = vprold_avx512vl(auVar12 ^ auVar13,0x10);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar10,auVar14);
  auVar12 = vpshufd_avx(auVar14,0x93);
  auVar9 = vprold_avx512vl(auVar12 ^ auVar9,0x14);
  auVar4 = vpaddd_avx(auVar4,auVar1);
  auVar4 = vpaddd_avx(auVar4,auVar9);
  auVar12 = vpshufd_avx(auVar4,0x39);
  auVar10 = vprold_avx512vl(auVar12 ^ auVar10,0x18);
  auVar14 = vpaddd_avx(auVar10,auVar14);
  auVar12 = vpshufd_avx(auVar9,0x39);
  auVar9 = vprold_avx512vl(auVar14 ^ auVar12,0x19);
  auVar4 = vpaddd_avx(auVar4,auVar3);
  auVar4 = vpaddd_avx(auVar4,auVar9);
  auVar12 = vpshufd_avx(auVar10,0x4e);
  auVar12 = vprold_avx512vl(auVar4 ^ auVar12,0x10);
  auVar14 = vpshufd_avx(auVar14,0x39);
  auVar14 = vpaddd_avx(auVar12,auVar14);
  auVar9 = vprold_avx512vl(auVar14 ^ auVar9,0x14);
  auVar4 = vpaddd_avx(auVar4,auVar2);
  auVar4 = vpaddd_avx(auVar4,auVar9);
  auVar12 = vprold_avx512vl(auVar4 ^ auVar12,0x18);
  auVar14 = vpaddd_avx(auVar12,auVar14);
  auVar4 = vpshufd_avx(auVar4,0x4e);
  *(undefined1 (*) [16])cv = auVar14 ^ auVar4;
  auVar4 = vpshufd_avx(auVar12,0x93);
  auVar14 = vpshufd_avx(auVar14 ^ auVar9,0x39);
  auVar14 = vprold_avx512vl(auVar14,0x19);
  *(undefined1 (*) [16])(cv + 4) = auVar14 ^ auVar4;
  return;
}

Assistant:

void blake3_compress_in_place_portable(uint32_t cv[8],
                                       const uint8_t block[BLAKE3_BLOCK_LEN],
                                       uint8_t block_len, uint64_t counter,
                                       uint8_t flags) {
  uint32_t state[16];
  compress_pre(state, cv, block, block_len, counter, flags);
  cv[0] = state[0] ^ state[8];
  cv[1] = state[1] ^ state[9];
  cv[2] = state[2] ^ state[10];
  cv[3] = state[3] ^ state[11];
  cv[4] = state[4] ^ state[12];
  cv[5] = state[5] ^ state[13];
  cv[6] = state[6] ^ state[14];
  cv[7] = state[7] ^ state[15];
}